

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cms_query_statistics.cc
# Opt level: O2

int __thiscall
aliyun::Cms::QueryStatistics
          (Cms *this,CmsQueryStatisticsRequestType *req,CmsQueryStatisticsResponseType *response,
          CmsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *this_01;
  uint index;
  char *pcVar5;
  string sStack_548;
  Value val;
  allocator<char> local_50c;
  allocator<char> local_50b;
  allocator<char> local_50a;
  allocator<char> local_509;
  CmsQueryStatisticsResponseType *local_508;
  value_type local_500;
  string str_response;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar5 = "http";
  if (this->use_tls_ != false) {
    pcVar5 = "https";
  }
  local_508 = response;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar5,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&sStack_548);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_500);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar5 = this->proxy_host_, pcVar5 != (char *)0x0)) &&
     (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar5,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&sStack_548);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"QueryStatistics",(allocator<char> *)&local_500);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->project)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Project",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->metric)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Metric",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->metric);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->period)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"Period",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->period);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->start_time)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"StartTime",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->start_time);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->end_time)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"EndTime",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->end_time);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->dimensions)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"Dimensions",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->dimensions);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((req->target_period)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"TargetPeriod",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_400,(string *)&req->target_period);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if ((req->function)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"Function",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_440,(string *)&req->function);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_420,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
  }
  if ((req->extend)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"Extend",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string((string *)&local_480,(string *)&req->extend);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_460,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"RegionId",(allocator<char> *)&sStack_548);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,this->region_id_,(allocator<char> *)&local_500);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4a0,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (CmsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_548,anon_var_dwarf_19d9b3 + 9,&local_509);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&sStack_548);
        std::__cxx11::string::~string((string *)&sStack_548);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_548,anon_var_dwarf_19d9b3 + 9,&local_50a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&sStack_548);
        std::__cxx11::string::~string((string *)&sStack_548);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_548,anon_var_dwarf_19d9b3 + 9,&local_50b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&sStack_548);
        std::__cxx11::string::~string((string *)&sStack_548);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_548,anon_var_dwarf_19d9b3 + 9,&local_50c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&sStack_548);
        std::__cxx11::string::~string((string *)&sStack_548);
      }
      if (local_508 != (CmsQueryStatisticsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
          std::__cxx11::string::operator=((string *)&local_508->code,(string *)&sStack_548);
          std::__cxx11::string::~string((string *)&sStack_548);
        }
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
          std::__cxx11::string::operator=((string *)&local_508->message,(string *)&sStack_548);
          std::__cxx11::string::~string((string *)&sStack_548);
        }
        bVar1 = Json::Value::isMember(&val,"Success");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Success");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
          std::__cxx11::string::operator=((string *)&local_508->success,(string *)&sStack_548);
          std::__cxx11::string::~string((string *)&sStack_548);
        }
        bVar1 = Json::Value::isMember(&val,"TraceId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"TraceId");
          Json::Value::asString_abi_cxx11_(&sStack_548,pVVar4);
          std::__cxx11::string::operator=((string *)&local_508->trace_id,(string *)&sStack_548);
          std::__cxx11::string::~string((string *)&sStack_548);
        }
        bVar1 = Json::Value::isMember(&val,"Datapoints");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Datapoints");
          bVar1 = Json::Value::isMember(pVVar4,"Datapoint");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Datapoints");
            pVVar4 = Json::Value::operator[](pVVar4,"Datapoint");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3; index = index + 1) {
                local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
                local_500._M_string_length = 0;
                local_500.field_2._M_local_buf[0] = '\0';
                this_01 = Json::Value::operator[](pVVar4,index);
                Json::Value::asString_abi_cxx11_(&sStack_548,this_01);
                std::__cxx11::string::operator=((string *)&local_500,(string *)&sStack_548);
                std::__cxx11::string::~string((string *)&sStack_548);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_508->datapoints,&local_500);
                std::__cxx11::string::~string((string *)&local_500);
              }
            }
          }
        }
      }
      goto LAB_00141d67;
    }
  }
  iVar2 = -1;
  if (error_info != (CmsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00141d67:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Cms::QueryStatistics(const CmsQueryStatisticsRequestType& req,
                      CmsQueryStatisticsResponseType* response,
                       CmsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","QueryStatistics");
  if(!req.project.empty()) {
    req_rpc->AddRequestQuery("Project", req.project);
  }
  if(!req.metric.empty()) {
    req_rpc->AddRequestQuery("Metric", req.metric);
  }
  if(!req.period.empty()) {
    req_rpc->AddRequestQuery("Period", req.period);
  }
  if(!req.start_time.empty()) {
    req_rpc->AddRequestQuery("StartTime", req.start_time);
  }
  if(!req.end_time.empty()) {
    req_rpc->AddRequestQuery("EndTime", req.end_time);
  }
  if(!req.dimensions.empty()) {
    req_rpc->AddRequestQuery("Dimensions", req.dimensions);
  }
  if(!req.target_period.empty()) {
    req_rpc->AddRequestQuery("TargetPeriod", req.target_period);
  }
  if(!req.function.empty()) {
    req_rpc->AddRequestQuery("Function", req.function);
  }
  if(!req.extend.empty()) {
    req_rpc->AddRequestQuery("Extend", req.extend);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}